

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O2

void remove_tool_from_list(tool_t *target)

{
  int iVar1;
  tool_t *ptVar2;
  tool_t *t1;
  tool_t **pptVar3;
  
  t1 = tools;
  if (tools != (tool_t *)0x0) {
    iVar1 = tool_equal(tools,target);
    if (iVar1 == 0) {
      pptVar3 = &tools;
    }
    else {
      do {
        ptVar2 = t1;
        t1 = ptVar2->next_tool;
        if (t1 == (tool_t *)0x0) break;
        iVar1 = tool_equal(t1,target);
      } while (iVar1 != 0);
      iVar1 = tool_equal(t1,target);
      if (iVar1 != 0) {
        return;
      }
      pptVar3 = &ptVar2->next_tool;
      t1 = target;
    }
    *pptVar3 = t1->next_tool;
  }
  return;
}

Assistant:

void remove_tool_from_list(struct tool_t* target){
     if(!tools){
        return;
     }
     if(!tool_equal(tools,target)){
        tools = tools->next_tool;
        return;
     }
     struct tool_t *cur = tools;
     while( (cur!=NULL) && (cur->next_tool != NULL) && (tool_equal(cur->next_tool,target))){
        cur = cur->next_tool;
     }
     if(!tool_equal(cur->next_tool,target)){
        cur->next_tool = target->next_tool; 
     }
}